

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O0

int whisper_bench_full(whisper_params *params)

{
  uint uVar1;
  FILE *__stream;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  uint *in_RDI;
  undefined8 in_R9;
  int ret_7;
  int i_2;
  int ret_6;
  int i_1;
  int ret_5;
  int i;
  int ret_4;
  int ret_3;
  int ret_2;
  whisper_token tokens [512];
  int ret_1;
  int ret;
  int n_mels;
  whisper_context *ctx;
  whisper_context_params cparams;
  int local_8a8;
  int local_8a0;
  int local_898;
  undefined1 local_888 [2052];
  uint local_84;
  uint local_80;
  undefined4 local_7c;
  undefined4 local_78 [2];
  undefined4 uStack_70;
  undefined4 local_68;
  undefined4 uStack_60;
  undefined4 local_58;
  undefined4 uStack_50;
  long local_48;
  byte local_40;
  byte local_3f;
  uint *local_10;
  int local_4;
  
  local_10 = in_RDI;
  whisper_context_default_params(&local_40);
  local_40 = (byte)local_10[10] & 1;
  local_3f = *(byte *)((long)local_10 + 0x29) & 1;
  uVar4 = std::__cxx11::string::c_str();
  memcpy(local_78,&local_40,0x30);
  local_48 = whisper_init_from_file_with_params(uVar4);
  fprintf(_stderr,"\n");
  __stream = _stderr;
  uVar1 = *local_10;
  uVar2 = std::thread::hardware_concurrency();
  uVar4 = whisper_print_system_info();
  fprintf(__stream,"system_info: n_threads = %d / %d | %s\n",(ulong)uVar1,(ulong)uVar2,uVar4,in_R9,
          local_78[0],uStack_70,local_68,uStack_60,local_58,uStack_50);
  if (local_48 == 0) {
    fprintf(_stderr,"error: failed to initialize whisper context\n");
    local_4 = 2;
  }
  else {
    local_7c = whisper_model_n_mels(local_48);
    local_80 = whisper_set_mel(local_48,0,0,local_7c);
    if (local_80 == 0) {
      iVar3 = whisper_encode(local_48,0,*local_10);
      local_84 = (uint)(iVar3 != 0);
      if (local_84 == 0) {
        memset(local_888,0,0x800);
        iVar3 = whisper_decode(local_48,local_888,0x100,0,*local_10);
        if ((iVar3 != 0) == 0) {
          iVar3 = whisper_decode(local_48,local_888,1,0x100,*local_10);
          if ((iVar3 != 0) == 0) {
            whisper_reset_timings(local_48);
            iVar3 = whisper_encode(local_48,0,*local_10);
            if ((iVar3 != 0) == 0) {
              for (local_898 = 0; local_898 < 0x100; local_898 = local_898 + 1) {
                iVar3 = whisper_decode(local_48,local_888,1,local_898,*local_10);
                if ((iVar3 != 0) != 0) {
                  fprintf(_stderr,"error: failed to decode: %d\n",(ulong)(uint)(iVar3 != 0));
                  return 4;
                }
              }
              for (local_8a0 = 0; local_8a0 < 0x40; local_8a0 = local_8a0 + 1) {
                iVar3 = whisper_decode(local_48,local_888,5,0,*local_10);
                if ((iVar3 != 0) != 0) {
                  fprintf(_stderr,"error: failed to decode: %d\n",(ulong)(uint)(iVar3 != 0));
                  return 4;
                }
              }
              for (local_8a8 = 0; local_8a8 < 0x10; local_8a8 = local_8a8 + 1) {
                iVar3 = whisper_decode(local_48,local_888,0x100,0,*local_10);
                if ((iVar3 != 0) != 0) {
                  fprintf(_stderr,"error: failed to decode: %d\n",(ulong)(uint)(iVar3 != 0));
                  return 4;
                }
              }
              whisper_print_timings(local_48);
              whisper_free(local_48);
              fprintf(_stderr,"\n");
              fprintf(_stderr,"If you wish, you can submit these results here:\n");
              fprintf(_stderr,"\n");
              fprintf(_stderr,"  https://github.com/ggerganov/whisper.cpp/issues/89\n");
              fprintf(_stderr,"\n");
              fprintf(_stderr,"Please include the following information:\n");
              fprintf(_stderr,"\n");
              fprintf(_stderr,"  - CPU model\n");
              fprintf(_stderr,"  - Operating system\n");
              fprintf(_stderr,"  - Compiler\n");
              fprintf(_stderr,"\n");
              local_4 = 0;
            }
            else {
              fprintf(_stderr,"error: failed to encode: %d\n",(ulong)(uint)(iVar3 != 0));
              local_4 = 4;
            }
          }
          else {
            fprintf(_stderr,"error: failed to decode: %d\n",(ulong)(uint)(iVar3 != 0));
            local_4 = 4;
          }
        }
        else {
          fprintf(_stderr,"error: failed to decode: %d\n",(ulong)(uint)(iVar3 != 0));
          local_4 = 4;
        }
      }
      else {
        fprintf(_stderr,"error: failed to encode: %d\n",(ulong)local_84);
        local_4 = 4;
      }
    }
    else {
      fprintf(_stderr,"error: failed to set mel: %d\n",(ulong)local_80);
      local_4 = 3;
    }
  }
  return local_4;
}

Assistant:

static int whisper_bench_full(const whisper_params & params) {
    // whisper init

    struct whisper_context_params cparams = whisper_context_default_params();

    cparams.use_gpu    = params.use_gpu;
    cparams.flash_attn = params.flash_attn;

    struct whisper_context * ctx = whisper_init_from_file_with_params(params.model.c_str(), cparams);

    {
        fprintf(stderr, "\n");
        fprintf(stderr, "system_info: n_threads = %d / %d | %s\n", params.n_threads, std::thread::hardware_concurrency(), whisper_print_system_info());
    }

    if (ctx == nullptr) {
        fprintf(stderr, "error: failed to initialize whisper context\n");
        return 2;
    }

    const int n_mels = whisper_model_n_mels(ctx);

    if (int ret = whisper_set_mel(ctx, nullptr, 0, n_mels)) {
        fprintf(stderr, "error: failed to set mel: %d\n", ret);
        return 3;
    }
    // heat encoder
    if (int ret = whisper_encode(ctx, 0, params.n_threads) != 0) {
        fprintf(stderr, "error: failed to encode: %d\n", ret);
        return 4;
    }

    whisper_token tokens[512];
    memset(tokens, 0, sizeof(tokens));

    // prompt heat
    if (int ret = whisper_decode(ctx, tokens, 256, 0, params.n_threads) != 0) {
        fprintf(stderr, "error: failed to decode: %d\n", ret);
        return 4;
    }

    // text-generation heat
    if (int ret = whisper_decode(ctx, tokens, 1, 256, params.n_threads) != 0) {
        fprintf(stderr, "error: failed to decode: %d\n", ret);
        return 4;
    }

    whisper_reset_timings(ctx);

    // actual run
    if (int ret = whisper_encode(ctx, 0, params.n_threads) != 0) {
        fprintf(stderr, "error: failed to encode: %d\n", ret);
        return 4;
    }

    // text-generation
    for (int i = 0; i < 256; i++) {
        if (int ret = whisper_decode(ctx, tokens, 1, i, params.n_threads) != 0) {
            fprintf(stderr, "error: failed to decode: %d\n", ret);
            return 4;
        }
    }

    // batched decoding
    for (int i = 0; i < 64; i++) {
        if (int ret = whisper_decode(ctx, tokens, 5, 0, params.n_threads) != 0) {
            fprintf(stderr, "error: failed to decode: %d\n", ret);
            return 4;
        }
    }

    // prompt processing
    for (int i = 0; i < 16; i++) {
        if (int ret = whisper_decode(ctx, tokens, 256, 0, params.n_threads) != 0) {
            fprintf(stderr, "error: failed to decode: %d\n", ret);
            return 4;
        }
    }

    whisper_print_timings(ctx);
    whisper_free(ctx);

    fprintf(stderr, "\n");
    fprintf(stderr, "If you wish, you can submit these results here:\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "  https://github.com/ggerganov/whisper.cpp/issues/89\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "Please include the following information:\n");
    fprintf(stderr, "\n");
    fprintf(stderr, "  - CPU model\n");
    fprintf(stderr, "  - Operating system\n");
    fprintf(stderr, "  - Compiler\n");
    fprintf(stderr, "\n");

    return 0;
}